

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::mirror(CImg<unsigned_char> *this,char axis)

{
  uchar uVar1;
  uint uVar2;
  ulong uVar3;
  void *__dest;
  long lVar4;
  CImgArgumentException *this_00;
  byte bVar5;
  uchar *puVar6;
  size_t __n;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  uchar *__src;
  ulong uVar15;
  
  __src = this->_data;
  uVar9 = this->_width;
  __n = (size_t)uVar9;
  uVar13 = this->_height;
  uVar15 = (ulong)uVar13;
  uVar2 = this->_depth;
  uVar3 = (ulong)uVar2;
  uVar8 = this->_spectrum;
  if (uVar8 != 0 && ((uVar2 != 0 && uVar13 != 0) && (uVar9 != 0 && __src != (uchar *)0x0))) {
    bVar5 = axis + 0x20;
    if ((byte)(axis + 0xa5U) < 0xe6) {
      bVar5 = axis;
    }
    if (bVar5 < 0x79) {
      if (bVar5 != 99) {
        if (bVar5 == 0x78) {
          if (uVar2 * uVar13 * uVar8 == 0) {
            return this;
          }
          uVar2 = uVar9 >> 1;
          puVar6 = __src + (uVar9 - 1);
          uVar7 = 0;
          uVar13 = uVar9;
          do {
            uVar10 = uVar2;
            if (1 < uVar9) {
              do {
                uVar1 = *__src;
                *__src = *puVar6;
                __src = __src + 1;
                *puVar6 = uVar1;
                puVar6 = puVar6 + -1;
                uVar10 = uVar10 - 1;
              } while (uVar10 != 0);
              uVar13 = this->_width;
              uVar15 = (ulong)this->_height;
              uVar3 = (ulong)this->_depth;
              uVar8 = this->_spectrum;
            }
            __src = __src + (uVar13 - uVar2);
            puVar6 = puVar6 + (uVar13 + uVar2);
            uVar7 = uVar7 + 1;
          } while (uVar7 < (int)uVar3 * (int)uVar15 * uVar8);
          return this;
        }
LAB_001a517b:
        this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
        pcVar12 = "non-";
        if (this->_is_shared != false) {
          pcVar12 = "";
        }
        CImgArgumentException::CImgArgumentException
                  (this_00,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::mirror(): Invalid specified axis \'%c\'."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar12,"unsigned char",(ulong)(uint)(int)axis
                  );
        __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
      }
      uVar14 = uVar15 * __n * (ulong)uVar2;
      __dest = operator_new__(uVar14);
      if (1 < uVar8) {
        uVar9 = uVar8 >> 1;
        puVar6 = __src + uVar14 * (uVar8 - 1);
        do {
          uVar3 = (ulong)(uint)((int)uVar15 * (int)__n * (int)uVar3);
          memcpy(__dest,__src,uVar3);
          memcpy(__src,puVar6,uVar3);
          memcpy(puVar6,__dest,(ulong)(this->_height * this->_width * this->_depth));
          __n = (size_t)this->_width;
          uVar15 = (ulong)this->_height;
          uVar3 = (ulong)this->_depth;
          lVar4 = uVar15 * __n * uVar3;
          __src = __src + lVar4;
          puVar6 = puVar6 + -lVar4;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
    }
    else if (bVar5 == 0x79) {
      __dest = operator_new__(__n);
      if (uVar8 * uVar2 != 0) {
        uVar2 = uVar13 >> 1;
        puVar6 = __src + (uVar13 - 1) * __n;
        uVar7 = 0;
        uVar9 = uVar13;
        do {
          uVar10 = uVar2;
          if (1 < uVar13) {
            do {
              memcpy(__dest,__src,__n);
              memcpy(__src,puVar6,__n);
              memcpy(puVar6,__dest,(ulong)this->_width);
              __n = (size_t)this->_width;
              __src = __src + __n;
              puVar6 = puVar6 + -__n;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
            uVar9 = this->_height;
            uVar3 = (ulong)this->_depth;
            uVar8 = this->_spectrum;
            __n = (size_t)this->_width;
          }
          __src = __src + (uVar9 - uVar2) * __n;
          puVar6 = puVar6 + (uVar9 + uVar2) * __n;
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar8 * (int)uVar3);
      }
    }
    else {
      if (bVar5 != 0x7a) goto LAB_001a517b;
      __dest = operator_new__(uVar15 * __n);
      if (0 < (int)uVar8) {
        uVar9 = uVar2 >> 1;
        puVar6 = __src + uVar15 * __n * (ulong)(uVar2 - 1);
        iVar11 = 0;
        do {
          uVar13 = uVar9;
          if (uVar2 < 2) {
            lVar4 = uVar15 * __n;
          }
          else {
            do {
              uVar3 = (ulong)(uint)((int)uVar15 * (int)__n);
              memcpy(__dest,__src,uVar3);
              memcpy(__src,puVar6,uVar3);
              memcpy(puVar6,__dest,(ulong)(this->_height * this->_width));
              __n = (size_t)this->_width;
              uVar15 = (ulong)this->_height;
              lVar4 = uVar15 * __n;
              __src = __src + lVar4;
              puVar6 = puVar6 + -lVar4;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
            uVar3 = (ulong)this->_depth;
            uVar8 = this->_spectrum;
          }
          __src = __src + (ulong)((int)uVar3 - uVar9) * lVar4;
          puVar6 = puVar6 + (ulong)((int)uVar3 + uVar9) * lVar4;
          iVar11 = iVar11 + 1;
        } while (iVar11 < (int)uVar8);
      }
    }
    operator_delete__(__dest);
  }
  return this;
}

Assistant:

CImg<T>& mirror(const char axis) {
      if (is_empty()) return *this;
      T *pf, *pb, *buf = 0;
      switch (cimg::lowercase(axis)) {
      case 'x' : {
        pf = _data; pb = data(_width - 1);
        const unsigned int width2 = _width/2;
        for (unsigned int yzv = 0; yzv<_height*_depth*_spectrum; ++yzv) {
          for (unsigned int x = 0; x<width2; ++x) { const T val = *pf; *(pf++) = *pb; *(pb--) = val; }
          pf+=_width - width2;
          pb+=_width + width2;
        }
      } break;
      case 'y' : {
        buf = new T[_width];
        pf = _data; pb = data(0,_height - 1);
        const unsigned int height2 = _height/2;
        for (unsigned int zv = 0; zv<_depth*_spectrum; ++zv) {
          for (unsigned int y = 0; y<height2; ++y) {
            std::memcpy(buf,pf,_width*sizeof(T));
            std::memcpy(pf,pb,_width*sizeof(T));
            std::memcpy(pb,buf,_width*sizeof(T));
            pf+=_width;
            pb-=_width;
          }
          pf+=(ulongT)_width*(_height - height2);
          pb+=(ulongT)_width*(_height + height2);
        }
      } break;
      case 'z' : {
        buf = new T[(ulongT)_width*_height];
        pf = _data; pb = data(0,0,_depth - 1);
        const unsigned int depth2 = _depth/2;
        cimg_forC(*this,c) {
          for (unsigned int z = 0; z<depth2; ++z) {
            std::memcpy(buf,pf,_width*_height*sizeof(T));
            std::memcpy(pf,pb,_width*_height*sizeof(T));
            std::memcpy(pb,buf,_width*_height*sizeof(T));
            pf+=(ulongT)_width*_height;
            pb-=(ulongT)_width*_height;
          }
          pf+=(ulongT)_width*_height*(_depth - depth2);
          pb+=(ulongT)_width*_height*(_depth + depth2);
        }
      } break;
      case 'c' : {
        buf = new T[(ulongT)_width*_height*_depth];
        pf = _data; pb = data(0,0,0,_spectrum - 1);
        const unsigned int _spectrum2 = _spectrum/2;
        for (unsigned int v = 0; v<_spectrum2; ++v) {
          std::memcpy(buf,pf,_width*_height*_depth*sizeof(T));
          std::memcpy(pf,pb,_width*_height*_depth*sizeof(T));
          std::memcpy(pb,buf,_width*_height*_depth*sizeof(T));
          pf+=(ulongT)_width*_height*_depth;
          pb-=(ulongT)_width*_height*_depth;
        }
      } break;
      default :
        throw CImgArgumentException(_cimg_instance
                                    "mirror(): Invalid specified axis '%c'.",
                                    cimg_instance,
                                    axis);
      }
      delete[] buf;
      return *this;
    }